

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

bool nullcInitIOModule(void *context,_func_uint_void_ptr_char_ptr_uint *writeFunc,
                      _func_uint_void_ptr_char_ptr_uint *readFunc)

{
  nullres nVar1;
  _func_uint_void_ptr_char_ptr_uint *readFunc_local;
  _func_uint_void_ptr_char_ptr_uint *writeFunc_local;
  void *context_local;
  
  NULLCIO::contextFunc = context;
  NULLCIO::writeFunc = writeFunc;
  NULLCIO::readFunc = readFunc;
  nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray>("std.io",NULLCIO::WriteToConsole,"Print",0)
  ;
  if (nVar1 == '\0') {
    context_local._7_1_ = false;
  }
  else {
    nVar1 = nullcBindModuleFunctionHelper<void,int,int>("std.io",NULLCIO::WriteIntConsole,"Print",1)
    ;
    if (nVar1 == '\0') {
      context_local._7_1_ = false;
    }
    else {
      nVar1 = nullcBindModuleFunctionHelper<void,double,int>
                        ("std.io",NULLCIO::WriteDoubleConsole,"Print",2);
      if (nVar1 == '\0') {
        context_local._7_1_ = false;
      }
      else {
        nVar1 = nullcBindModuleFunctionHelper<void,long_long,int>
                          ("std.io",NULLCIO::WriteLongConsole,"Print",3);
        if (nVar1 == '\0') {
          context_local._7_1_ = false;
        }
        else {
          nVar1 = nullcBindModuleFunctionHelper<void,char>
                            ("std.io",NULLCIO::WriteCharConsole,"Print",4);
          if (nVar1 == '\0') {
            context_local._7_1_ = false;
          }
          else {
            nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray>
                              ("std.io",NULLCIO::ReadTextFromConsole,"Input",0);
            if (nVar1 == '\0') {
              context_local._7_1_ = false;
            }
            else {
              nVar1 = nullcBindModuleFunctionHelper<void,int*>
                                ("std.io",NULLCIO::ReadIntFromConsole,"Input",1);
              if (nVar1 == '\0') {
                context_local._7_1_ = false;
              }
              else {
                nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray>
                                  ("std.io",NULLCIO::WriteToConsoleExact,"Write",0);
                if (nVar1 == '\0') {
                  context_local._7_1_ = false;
                }
                else {
                  nVar1 = nullcBindModuleFunctionHelper<void,int,int>
                                    ("std.io",NULLCIO::SetConsoleCursorPos,"SetConsoleCursorPos",0);
                  if (nVar1 == '\0') {
                    context_local._7_1_ = false;
                  }
                  else {
                    nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray>
                                      ("std.io",NULLCIO::GetKeyboardState,"GetKeyboardState",0);
                    if (nVar1 == '\0') {
                      context_local._7_1_ = false;
                    }
                    else {
                      nVar1 = nullcBindModuleFunctionHelper<void,int*,int*>
                                        ("std.io",NULLCIO::GetMouseState,"GetMouseState",0);
                      if (nVar1 == '\0') {
                        context_local._7_1_ = false;
                      }
                      else {
                        nVar1 = nullcBindModuleFunctionHelper<bool,int>
                                          ("std.io",NULLCIO::IsPressed,"IsPressed",0);
                        if (nVar1 == '\0') {
                          context_local._7_1_ = false;
                        }
                        else {
                          nVar1 = nullcBindModuleFunctionHelper<bool,int>
                                            ("std.io",NULLCIO::IsToggled,"IsToggled",0);
                          if (nVar1 == '\0') {
                            context_local._7_1_ = false;
                          }
                          else {
                            nVar1 = nullcBindModuleFunctionHelper<bool,int>
                                              ("std.io",NULLCIO::IsPressed,"IsPressed",1);
                            if (nVar1 == '\0') {
                              context_local._7_1_ = false;
                            }
                            else {
                              nVar1 = nullcBindModuleFunctionHelper<bool,int>
                                                ("std.io",NULLCIO::IsToggled,"IsToggled",1);
                              if (nVar1 == '\0') {
                                context_local._7_1_ = false;
                              }
                              else {
                                context_local._7_1_ = true;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return context_local._7_1_;
}

Assistant:

bool nullcInitIOModule(void *context, unsigned (*writeFunc)(void *context, char *data, unsigned length), unsigned (*readFunc)(void *context, char *target, unsigned length))
{
	NULLCIO::contextFunc = context;
	NULLCIO::writeFunc = writeFunc;
	NULLCIO::readFunc = readFunc;

	REGISTER_FUNC(WriteToConsole, "Print", 0);
	REGISTER_FUNC(WriteIntConsole, "Print", 1);
	REGISTER_FUNC(WriteDoubleConsole, "Print", 2);
	REGISTER_FUNC(WriteLongConsole, "Print", 3);
	REGISTER_FUNC(WriteCharConsole, "Print", 4);
	REGISTER_FUNC(ReadTextFromConsole, "Input", 0);
	REGISTER_FUNC(ReadIntFromConsole, "Input", 1);
	REGISTER_FUNC(WriteToConsoleExact, "Write", 0);
	REGISTER_FUNC(SetConsoleCursorPos, "SetConsoleCursorPos", 0);

	REGISTER_FUNC(GetKeyboardState, "GetKeyboardState", 0);
	REGISTER_FUNC(GetMouseState, "GetMouseState", 0);
	REGISTER_FUNC(IsPressed, "IsPressed", 0);
	REGISTER_FUNC(IsToggled, "IsToggled", 0);
	REGISTER_FUNC(IsPressed, "IsPressed", 1);
	REGISTER_FUNC(IsToggled, "IsToggled", 1);

	return true;
}